

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_double_parser.h
# Opt level: O0

int fast_double_parser::leading_zeroes(uint64_t input_num)

{
  long lVar1;
  uint64_t input_num_local;
  
  lVar1 = 0x3f;
  if (input_num != 0) {
    for (; input_num >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  return (uint)lVar1 ^ 0x3f;
}

Assistant:

inline int leading_zeroes(uint64_t input_num) {
#ifdef _MSC_VER
  unsigned long leading_zero = 0;
  // Search the mask data from most significant bit (MSB)
  // to least significant bit (LSB) for a set bit (1).
#ifdef _WIN64
  if (_BitScanReverse64(&leading_zero, input_num))
    return (int)(63 - leading_zero);
#else
  if (_BitScanReverse(&leading_zero, (uint32_t)(input_num >> 32)))
    return (int)(63 - (leading_zero + 32));
  if (_BitScanReverse(&leading_zero, (uint32_t)input_num))
    return (int)(63 - leading_zero);
#endif // _WIN64
#else
  return __builtin_clzll(input_num);
#endif // _MSC_VER
}